

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.cpp
# Opt level: O2

int mbedtls_cipher_auth_decrypt_ext
              (mbedtls_cipher_context_t *ctx,uchar *iv,size_t iv_len,uchar *ad,size_t ad_len,
              uchar *input,size_t ilen,uchar *output,size_t output_len,size_t *olen,size_t tag_len)

{
  int iVar1;
  int iVar2;
  size_t length;
  
  length = ilen - tag_len;
  iVar2 = -0x6100;
  if (((tag_len <= ilen) && (length <= output_len)) &&
     (iVar2 = -0x6080, (*(uint *)&ctx->cipher_info->field_0x8 & 0xf000) == 0x6000)) {
    *olen = length;
    iVar1 = mbedtls_gcm_auth_decrypt
                      ((mbedtls_gcm_context *)ctx->cipher_ctx,length,iv,iv_len,ad,ad_len,
                       input + (ilen - tag_len),tag_len,input,output);
    iVar2 = -0x6300;
    if (iVar1 != -0x12) {
      iVar2 = iVar1;
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_cipher_auth_decrypt_ext(mbedtls_cipher_context_t *ctx,
                                    const unsigned char *iv, size_t iv_len,
                                    const unsigned char *ad, size_t ad_len,
                                    const unsigned char *input, size_t ilen,
                                    unsigned char *output, size_t output_len,
                                    size_t *olen, size_t tag_len)
{
#if defined(MBEDTLS_NIST_KW_C)
    if (
#if defined(MBEDTLS_USE_PSA_CRYPTO) && !defined(MBEDTLS_DEPRECATED_REMOVED)
        ctx->psa_enabled == 0 &&
#endif
        (MBEDTLS_MODE_KW == ((mbedtls_cipher_mode_t) ctx->cipher_info->mode) ||
         MBEDTLS_MODE_KWP == ((mbedtls_cipher_mode_t) ctx->cipher_info->mode))) {
        mbedtls_nist_kw_mode_t mode =
            (MBEDTLS_MODE_KW == ((mbedtls_cipher_mode_t) ctx->cipher_info->mode)) ?
            MBEDTLS_KW_MODE_KW : MBEDTLS_KW_MODE_KWP;

        /* There is no iv, tag or ad associated with KW and KWP,
         * so these length should be 0 as documented. */
        if (iv_len != 0 || tag_len != 0 || ad_len != 0) {
            return MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA;
        }

        (void) iv;
        (void) ad;

        return mbedtls_nist_kw_unwrap(ctx->cipher_ctx, mode, input, ilen,
                                      output, olen, output_len);
    }
#endif /* MBEDTLS_NIST_KW_C */

#if defined(MBEDTLS_CIPHER_MODE_AEAD)
    /* AEAD case: check length before passing on to shared function */
    if (ilen < tag_len || output_len < ilen - tag_len) {
        return MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA;
    }

    return mbedtls_cipher_aead_decrypt(ctx, iv, iv_len, ad, ad_len,
                                       input, ilen - tag_len, output, olen,
                                       input + ilen - tag_len, tag_len);
#else
    return MBEDTLS_ERR_CIPHER_FEATURE_UNAVAILABLE;
#endif /* MBEDTLS_CIPHER_MODE_AEAD */
}